

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O2

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  int iVar1;
  long lVar2;
  long lVar3;
  sexp psVar4;
  sexp_conflict psVar5;
  sexp_conflict op;
  sexp_conflict name;
  sexp_conflict tmp;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  sexp_gc_var_t local_30;
  
  name = (sexp_conflict)0x43e;
  tmp = (sexp_conflict)0x43e;
  op = (sexp_conflict)0x43e;
  iVar1 = strcmp(version,"0.11.0");
  psVar5 = (sexp_conflict)0xb3e;
  if (iVar1 == 0) {
    iVar1 = strncmp(abi,"cv-gm*uh",8);
    if (iVar1 == 0) {
      local_50.var = &name;
      local_30.next = &local_50;
      local_50.next = (ctx->value).context.saves;
      local_30.var = &tmp;
      local_40.next = &local_30;
      (ctx->value).context.saves = &local_40;
      local_40.var = &op;
      name = (sexp_conflict)sexp_intern(ctx,"winsize",0xffffffffffffffff);
      lVar2 = sexp_env_ref(ctx,env,name,0x3e);
      if (lVar2 == 0x3e) {
        sexp_warn(ctx,"couldn\'t import declared type: ",name);
      }
      name = (sexp_conflict)sexp_intern(ctx,"termios",0xffffffffffffffff);
      lVar3 = sexp_env_ref(ctx,env,name,0x3e);
      if (lVar3 == 0x3e) {
        sexp_warn(ctx,"couldn\'t import declared type: ",name);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"login-tty",1,0,"sexp_login_tty_stub",sexp_login_tty_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)0x25;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"forkpty",2,1,"sexp_forkpty_stub",sexp_forkpty_stub,0x3e)
      ;
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)0x25;
        (op->value).port.offset = 9;
        (op->value).type.dl = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
        psVar4 = (sexp)sexp_make_vector_op(ctx,0,2,3,1);
        (op->value).type.finalize_name = psVar4;
        (psVar4->value).type.cpl = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"openpty",2,1,"sexp_openpty_stub",sexp_openpty_stub,0x3e)
      ;
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)0x25;
        (op->value).port.offset = 0x25;
        (op->value).port.line = 9;
        psVar4 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar4;
        (psVar4->value).type.cpl = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
        (((op->value).type.finalize_name)->value).type.slots =
             (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
      }
      (ctx->value).context.saves = local_50.next;
      psVar5 = (sexp_conflict)0x43e;
    }
  }
  return psVar5;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  sexp sexp_winsize_type_obj;
  sexp sexp_termios_type_obj;
  sexp_gc_var3(name, tmp, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, tmp, op);
  name = sexp_intern(ctx, "winsize", -1);
  sexp_winsize_type_obj = sexp_env_ref(ctx, env, name, SEXP_FALSE);
  if (sexp_not(sexp_winsize_type_obj)) {
    sexp_warn(ctx, "couldn't import declared type: ", name);
  }
  name = sexp_intern(ctx, "termios", -1);
  sexp_termios_type_obj = sexp_env_ref(ctx, env, name, SEXP_FALSE);
  if (sexp_not(sexp_termios_type_obj)) {
    sexp_warn(ctx, "couldn't import declared type: ", name);
  }
  op = sexp_define_foreign(ctx, env, "login-tty", 1, sexp_login_tty_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FILENO);
  }
  op = sexp_define_foreign_opt(ctx, env, "forkpty", 2, sexp_forkpty_stub, SEXP_FALSE);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_CHAR);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_ONE, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(sexp_type_tag(sexp_winsize_type_obj)));
  }
  op = sexp_define_foreign_opt(ctx, env, "openpty", 2, sexp_openpty_stub, SEXP_FALSE);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_CHAR);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj)));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(sexp_type_tag(sexp_winsize_type_obj)));
  }
  sexp_gc_release3(ctx);
  return SEXP_VOID;
}